

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI.cpp
# Opt level: O0

string * __thiscall CLI::getBinary_abi_cxx11_(string *__return_storage_ptr__,CLI *this)

{
  bool bVar1;
  const_reference this_00;
  allocator<char> local_4d [20];
  allocator<char> local_39;
  string local_38;
  CLI *local_18;
  CLI *this_local;
  
  local_18 = this;
  this_local = (CLI *)__return_storage_ptr__;
  bVar1 = std::vector<A2,_std::allocator<A2>_>::empty(&this->_args);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",local_4d)
    ;
    std::allocator<char>::~allocator(local_4d);
  }
  else {
    this_00 = std::vector<A2,_std::allocator<A2>_>::operator[](&this->_args,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"raw",&local_39);
    A2::attribute(__return_storage_ptr__,this_00,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CLI::getBinary () const
{
  if (! _args.empty ())
    return _args[0].attribute ("raw");

  return "";
}